

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

CustomDataSource *
google::protobuf::Arena::CreateMaybeMessage<bloaty::CustomDataSource>(Arena *arena)

{
  type_info *in_RDI;
  size_t n;
  size_t in_stack_ffffffffffffff90;
  Arena *in_stack_ffffffffffffffa0;
  type_info *n_00;
  ArenaImpl *in_stack_ffffffffffffffb0;
  undefined8 local_38;
  
  if (in_RDI == (type_info *)0x0) {
    local_38 = (CustomDataSource *)operator_new(0x40);
    bloaty::CustomDataSource::CustomDataSource((CustomDataSource *)in_stack_ffffffffffffffb0);
  }
  else {
    n_00 = in_RDI;
    internal::AlignUpTo8(0x40);
    AllocHook(in_stack_ffffffffffffffa0,in_RDI,in_stack_ffffffffffffff90);
    local_38 = (CustomDataSource *)
               internal::ArenaImpl::AllocateAlignedAndAddCleanup
                         (in_stack_ffffffffffffffb0,(size_t)n_00,
                          (_func_void_void_ptr *)in_stack_ffffffffffffffa0);
    bloaty::CustomDataSource::CustomDataSource((CustomDataSource *)in_stack_ffffffffffffffb0);
  }
  return local_38;
}

Assistant:

PROTOBUF_NOINLINE ::bloaty::CustomDataSource* Arena::CreateMaybeMessage< ::bloaty::CustomDataSource >(Arena* arena) {
  return Arena::CreateInternal< ::bloaty::CustomDataSource >(arena);
}